

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float rounding,
                   int rounding_corners_flags,float thickness)

{
  int iVar1;
  ImVec2 *__src;
  ImVec2 *__dest;
  uint uVar2;
  ulong uVar3;
  float fVar4;
  ImVec2 local_30;
  ImVec2 local_28;
  
  if (0xffffff < col) {
    if ((this->Flags & 1) == 0) {
      local_28.y = a->y + 0.5;
      local_28.x = a->x + 0.5;
      fVar4 = -0.49;
    }
    else {
      local_28.y = a->y + 0.5;
      local_28.x = a->x + 0.5;
      fVar4 = -0.5;
    }
    local_30.y = fVar4 + b->y;
    local_30.x = b->x + fVar4;
    PathRect(this,&local_28,&local_30,rounding,rounding_corners_flags);
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,true,thickness);
    iVar1 = (this->_Path).Capacity;
    if (iVar1 < 0) {
      uVar2 = iVar1 / 2 + iVar1;
      uVar3 = 0;
      if (0 < (int)uVar2) {
        uVar3 = (ulong)uVar2;
      }
      __dest = (ImVec2 *)ImGui::MemAlloc(uVar3 * 8);
      __src = (this->_Path).Data;
      if (__src != (ImVec2 *)0x0) {
        memcpy(__dest,__src,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = __dest;
      (this->_Path).Capacity = (int)uVar3;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddRect(const ImVec2& a, const ImVec2& b, ImU32 col, float rounding, int rounding_corners_flags, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
        PathRect(a + ImVec2(0.5f,0.5f), b - ImVec2(0.50f,0.50f), rounding, rounding_corners_flags);
    else
        PathRect(a + ImVec2(0.5f,0.5f), b - ImVec2(0.49f,0.49f), rounding, rounding_corners_flags); // Better looking lower-right corner and rounded non-AA shapes.
    PathStroke(col, true, thickness);
}